

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::TextureUnitCase::deinit(TextureUnitCase *this)

{
  Texture2D *this_00;
  TextureCube *this_01;
  bool bVar1;
  reference ppTVar2;
  reference ppTVar3;
  __normal_iterator<tcu::TextureCube_**,_std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>_>
  local_38;
  __normal_iterator<tcu::TextureCube_**,_std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>_>
  local_30;
  iterator i_1;
  __normal_iterator<tcu::Texture2D_**,_std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>_>
  local_20;
  __normal_iterator<tcu::Texture2D_**,_std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>_>
  local_18;
  iterator i;
  TextureUnitCase *this_local;
  
  i._M_current = (Texture2D **)this;
  local_18._M_current =
       (Texture2D **)
       std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::begin(&this->m_textures2d);
  while( true ) {
    local_20._M_current =
         (Texture2D **)
         std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::end(&this->m_textures2d);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<tcu::Texture2D_**,_std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppTVar2;
    if (this_00 != (Texture2D *)0x0) {
      tcu::Texture2D::~Texture2D(this_00);
      operator_delete(this_00,0x50);
    }
    i_1._M_current =
         (TextureCube **)
         __gnu_cxx::
         __normal_iterator<tcu::Texture2D_**,_std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>_>
         ::operator++(&local_18,0);
  }
  std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::clear(&this->m_textures2d);
  local_30._M_current =
       (TextureCube **)
       std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::begin
                 (&this->m_texturesCube);
  while( true ) {
    local_38._M_current =
         (TextureCube **)
         std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::end
                   (&this->m_texturesCube);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<tcu::TextureCube_**,_std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>_>
              ::operator*(&local_30);
    this_01 = *ppTVar3;
    if (this_01 != (TextureCube *)0x0) {
      tcu::TextureCube::~TextureCube(this_01);
      operator_delete(this_01,0x168);
    }
    __gnu_cxx::
    __normal_iterator<tcu::TextureCube_**,_std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>_>
    ::operator++(&local_30,0);
  }
  std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::clear(&this->m_texturesCube)
  ;
  if (this->m_shader != (MultiTexShader *)0x0) {
    (*(this->m_shader->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])();
  }
  this->m_shader = (MultiTexShader *)0x0;
  return;
}

Assistant:

void TextureUnitCase::deinit (void)
{
	for (vector<tcu::Texture2D*>::iterator i = m_textures2d.begin(); i != m_textures2d.end(); i++)
		delete *i;
	m_textures2d.clear();

	for (vector<tcu::TextureCube*>::iterator i = m_texturesCube.begin(); i != m_texturesCube.end(); i++)
		delete *i;
	m_texturesCube.clear();

	delete m_shader;
	m_shader = DE_NULL;
}